

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

void __thiscall ON_OffsetSurface::ON_OffsetSurface(ON_OffsetSurface *this,ON_OffsetSurface *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ON_Surface *pOVar10;
  
  ON_SurfaceProxy::ON_SurfaceProxy(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00816f40;
  this->m__pSrf = (ON_Surface *)0x0;
  uVar1 = *(undefined8 *)&(src->m_offset_function).field_0x8;
  uVar2 = *(undefined8 *)&(src->m_offset_function).field_0x10;
  uVar3 = *(undefined8 *)&(src->m_offset_function).field_0x18;
  uVar4 = *(undefined8 *)&(src->m_offset_function).field_0x1c;
  uVar5 = *(undefined4 *)&(src->m_offset_function).field_0x24;
  bVar6 = (src->m_offset_function).m_bZeroSideDerivative[0];
  bVar7 = (src->m_offset_function).m_bZeroSideDerivative[1];
  bVar8 = (src->m_offset_function).m_bZeroSideDerivative[2];
  bVar9 = (src->m_offset_function).m_bZeroSideDerivative[3];
  (this->m_offset_function).m_srf = (src->m_offset_function).m_srf;
  *(undefined8 *)&(this->m_offset_function).field_0x8 = uVar1;
  *(undefined8 *)&(this->m_offset_function).field_0x10 = uVar2;
  *(undefined8 *)&(this->m_offset_function).field_0x18 = uVar3;
  *(undefined8 *)&(this->m_offset_function).field_0x1c = uVar4;
  *(undefined4 *)&(this->m_offset_function).field_0x24 = uVar5;
  (this->m_offset_function).m_bZeroSideDerivative[0] = bVar6;
  (this->m_offset_function).m_bZeroSideDerivative[1] = bVar7;
  (this->m_offset_function).m_bZeroSideDerivative[2] = bVar8;
  (this->m_offset_function).m_bZeroSideDerivative[3] = bVar9;
  (this->m_offset_function).m_offset_value._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_00817168;
  (this->m_offset_function).m_offset_value.m_a = (ON_OffsetSurfaceValue *)0x0;
  (this->m_offset_function).m_offset_value.m_count = 0;
  (this->m_offset_function).m_offset_value.m_capacity = 0;
  ON_SimpleArray<ON_OffsetSurfaceValue>::operator=
            (&(this->m_offset_function).m_offset_value,&(src->m_offset_function).m_offset_value);
  (this->m_offset_function).m_bumps._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_008171a8;
  (this->m_offset_function).m_bumps.m_a = (ON_BumpFunction *)0x0;
  (this->m_offset_function).m_bumps.m_count = 0;
  (this->m_offset_function).m_bumps.m_capacity = 0;
  ON_SimpleArray<ON_BumpFunction>::operator=
            (&(this->m_offset_function).m_bumps,&(src->m_offset_function).m_bumps);
  (this->m_offset_function).m_bValid = (src->m_offset_function).m_bValid;
  if (src->m__pSrf != (ON_Surface *)0x0) {
    pOVar10 = ON_SurfaceProxy::DuplicateSurface(&src->super_ON_SurfaceProxy);
    this->m__pSrf = pOVar10;
    ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pOVar10);
  }
  pOVar10 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
  ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar10);
  return;
}

Assistant:

ON_OffsetSurface::ON_OffsetSurface( const ON_OffsetSurface& src)
                 : ON_SurfaceProxy(src),
                   m__pSrf(0),
                   m_offset_function(src.m_offset_function)
{
  if ( 0 != src.m__pSrf )
  {
    m__pSrf = src.ON_SurfaceProxy::DuplicateSurface();
    SetProxySurface(m__pSrf);
  }
  m_offset_function.SetBaseSurface( BaseSurface() );
}